

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CGL::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  XMLElement *pXVar5;
  XMLElement *xml_00;
  XMLElement *xml_01;
  LightInfo *pLVar6;
  size_t sVar7;
  MaterialInfo *pMVar8;
  int i;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  anon_union_32_3_e2189aaa_for_Vector3D_0 aVar11;
  string s_1;
  string name;
  string sid;
  Matrix4x4 mat;
  string s;
  Node node;
  stringstream ss;
  undefined1 *local_5b8 [2];
  undefined1 local_5a8 [16];
  ios_base *local_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 uStack_580;
  XMLElement *local_570;
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548;
  long local_540;
  undefined1 local_538 [16];
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_528;
  undefined1 local_508 [16];
  double dStack_4f8;
  double dStack_4f0;
  undefined1 local_4e8 [16];
  double dStack_4d8;
  double dStack_4d0;
  undefined1 local_4c8 [16];
  double dStack_4b8;
  double dStack_4b0;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  double *local_368;
  double dStack_360;
  double dStack_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  double dStack_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double dStack_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double dStack_2f8;
  double dStack_2f0;
  int local_2e8;
  undefined4 uStack_2e4;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  Node local_288;
  double *local_1b8;
  double dStack_1b0;
  double dStack_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double dStack_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double dStack_148;
  double dStack_140;
  ios_base local_138 [264];
  
  Node::Node(&local_288);
  pcVar3 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace
            ((ulong)&local_288,0,(char *)local_288.id._M_string_length,(ulong)pcVar3);
  pcVar3 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace
            ((ulong)&local_288.name,0,(char *)local_288.name._M_string_length,(ulong)pcVar3);
  local_570 = xml;
  pXVar4 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
  local_598 = local_138;
  do {
    if (pXVar4 == (XMLElement *)0x0) break;
    pcVar3 = tinyxml2::XMLNode::Value(&pXVar4->super_XMLNode);
    std::__cxx11::string::string((string *)local_568,pcVar3,(allocator *)&local_1b8);
    iVar2 = std::__cxx11::string::compare((char *)local_568);
    _local_2e8 = CONCAT44(uStack_2e4,iVar2);
    if (iVar2 == 0) {
      pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&local_368,pcVar3,(allocator *)&local_1b8);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_1b8,(string *)&local_368,_S_out|_S_in);
      _local_4e8 = ZEXT1632(ZEXT816(0) << 0x40);
      local_528 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
      _local_508 = local_528;
      _local_4c8 = _local_4e8;
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,0);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,1);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,2);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,3);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,0);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,1);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,2);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,3);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,2,0);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,2,1);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,2,2);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,2,3);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,3,0);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,3,1);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,3,2);
      std::istream::_M_extract<double>((double *)&local_1b8);
      Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,3,3);
      std::istream::_M_extract<double>((double *)&local_1b8);
      local_288.transform.entries[3].field_0.field_0.x = (double)local_4c8._0_8_;
      local_288.transform.entries[3].field_0.field_0.y = (double)local_4c8._8_8_;
      local_288.transform.entries[3].field_0.field_0.z = dStack_4b8;
      local_288.transform.entries[3].field_0.field_0.w = dStack_4b0;
      local_288.transform.entries[2].field_0.field_0.x = (double)local_4e8._0_8_;
      local_288.transform.entries[2].field_0.field_0.y = (double)local_4e8._8_8_;
      local_288.transform.entries[2].field_0.field_0.z = dStack_4d8;
      local_288.transform.entries[2].field_0.field_0.w = dStack_4d0;
      local_288.transform.entries[1].field_0.field_0.x = (double)local_508._0_8_;
      local_288.transform.entries[1].field_0.field_0.y = (double)local_508._8_8_;
      local_288.transform.entries[1].field_0.field_0.z = dStack_4f8;
      local_288.transform.entries[1].field_0.field_0.w = dStack_4f0;
      local_288.transform.entries[0].field_0.field_0.x = local_528.field_0.x;
      local_288.transform.entries[0].field_0.field_0.y = local_528.field_0.y;
      local_288.transform.entries[0].field_0.field_0.z = local_528.field_0.z;
      local_288.transform.entries[0].field_0.field_0.w = local_528.field_0.w;
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_598);
      if (local_368 != &dStack_358) {
        operator_delete(local_368);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_568);
      if (iVar2 == 0) {
        _local_4e8 = ZEXT1632(ZEXT816(0) << 0x40);
        local_528 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        _local_508 = local_528;
        _local_4c8 = _local_4e8;
        pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5b8,pcVar3,(allocator *)&local_1b8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_1b8,(string *)local_5b8,_S_out|_S_in);
        pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"sid",(char *)0x0);
        std::__cxx11::string::string((string *)&local_548,pcVar3,(allocator *)&local_368);
        cVar1 = local_548[local_540 + -1];
        if (cVar1 == 'X') {
          Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,1);
          std::istream::_M_extract<double>((double *)&local_1b8);
          Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,2);
          std::istream::_M_extract<double>((double *)&local_1b8);
          iVar2 = 1;
          i = 2;
LAB_00111b39:
          Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,i,iVar2);
          iVar2 = 2;
          std::istream::_M_extract<double>((double *)&local_1b8);
LAB_00111b51:
          Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,iVar2,iVar2);
          std::istream::_M_extract<double>((double *)&local_1b8);
        }
        else {
          if (cVar1 == 'Y') {
            Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,0);
            std::istream::_M_extract<double>((double *)&local_1b8);
            Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,2,0);
            std::istream::_M_extract<double>((double *)&local_1b8);
            iVar2 = 2;
            i = 0;
            goto LAB_00111b39;
          }
          if (cVar1 == 'Z') {
            Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,0);
            std::istream::_M_extract<double>((double *)&local_1b8);
            Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,1);
            std::istream::_M_extract<double>((double *)&local_1b8);
            Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,0);
            iVar2 = 1;
            std::istream::_M_extract<double>((double *)&local_1b8);
            goto LAB_00111b51;
          }
        }
        Matrix4x4::operator*((Matrix4x4 *)&local_528.field_0,&local_288.transform);
        local_288.transform.entries[3].field_0.field_0.x = local_308;
        local_288.transform.entries[3].field_0.field_0.y = dStack_300;
        local_288.transform.entries[3].field_0.field_0.z = dStack_2f8;
        local_288.transform.entries[3].field_0.field_0.w = dStack_2f0;
        local_288.transform.entries[2].field_0.field_0.x = local_328;
        local_288.transform.entries[2].field_0.field_0.y = dStack_320;
        local_288.transform.entries[2].field_0.field_0.z = dStack_318;
        local_288.transform.entries[2].field_0.field_0.w = dStack_310;
        local_288.transform.entries[1].field_0.field_0.x = local_348;
        local_288.transform.entries[1].field_0.field_0.y = dStack_340;
        local_288.transform.entries[1].field_0.field_0.z = dStack_338;
        local_288.transform.entries[1].field_0.field_0.w = dStack_330;
        local_288.transform.entries[0].field_0.field_0.x = (double)local_368;
        local_288.transform.entries[0].field_0.field_0.y = dStack_360;
        local_288.transform.entries[0].field_0.field_0.z = dStack_358;
        local_288.transform.entries[0].field_0.field_0.w = dStack_350;
        if (local_548 != local_538) {
          operator_delete(local_548);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_598);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0]);
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)local_568);
      if (iVar2 == 0) {
        _local_4e8 = ZEXT1632(ZEXT816(0) << 0x40);
        local_528 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        _local_508 = local_528;
        _local_4c8 = _local_4e8;
        pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5b8,pcVar3,(allocator *)&local_1b8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_1b8,(string *)local_5b8,_S_out|_S_in);
        Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,3);
        std::istream::_M_extract<double>((double *)&local_1b8);
        Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,3);
        std::istream::_M_extract<double>((double *)&local_1b8);
        Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,2,3);
        std::istream::_M_extract<double>((double *)&local_1b8);
        Matrix4x4::operator*((Matrix4x4 *)&local_528.field_0,&local_288.transform);
        local_288.transform.entries[3].field_0.field_0.x = local_308;
        local_288.transform.entries[3].field_0.field_0.y = dStack_300;
        local_288.transform.entries[3].field_0.field_0.z = dStack_2f8;
        local_288.transform.entries[3].field_0.field_0.w = dStack_2f0;
        local_288.transform.entries[2].field_0.field_0.x = local_328;
        local_288.transform.entries[2].field_0.field_0.y = dStack_320;
        local_288.transform.entries[2].field_0.field_0.z = dStack_318;
        local_288.transform.entries[2].field_0.field_0.w = dStack_310;
        local_288.transform.entries[1].field_0.field_0.x = local_348;
        local_288.transform.entries[1].field_0.field_0.y = dStack_340;
        local_288.transform.entries[1].field_0.field_0.z = dStack_338;
        local_288.transform.entries[1].field_0.field_0.w = dStack_330;
        local_288.transform.entries[0].field_0.field_0.x = (double)local_368;
        local_288.transform.entries[0].field_0.field_0.y = dStack_360;
        local_288.transform.entries[0].field_0.field_0.z = dStack_358;
        local_288.transform.entries[0].field_0.field_0.w = dStack_350;
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_598);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0]);
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)local_568);
      if (iVar2 == 0) {
        _local_4e8 = ZEXT1632(ZEXT816(0) << 0x40);
        local_528 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        _local_508 = local_528;
        _local_4c8 = _local_4e8;
        pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5b8,pcVar3,(allocator *)&local_1b8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_1b8,(string *)local_5b8,_S_out|_S_in);
        Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,0,0);
        std::istream::_M_extract<double>((double *)&local_1b8);
        Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,1);
        std::istream::_M_extract<double>((double *)&local_1b8);
        Matrix4x4::operator()((Matrix4x4 *)&local_528.field_0,1,1);
        std::istream::_M_extract<double>((double *)&local_1b8);
        Matrix4x4::operator*((Matrix4x4 *)&local_528.field_0,&local_288.transform);
        local_288.transform.entries[3].field_0.field_0.x = local_308;
        local_288.transform.entries[3].field_0.field_0.y = dStack_300;
        local_288.transform.entries[3].field_0.field_0.z = dStack_2f8;
        local_288.transform.entries[3].field_0.field_0.w = dStack_2f0;
        local_288.transform.entries[2].field_0.field_0.x = local_328;
        local_288.transform.entries[2].field_0.field_0.y = dStack_320;
        local_288.transform.entries[2].field_0.field_0.z = dStack_318;
        local_288.transform.entries[2].field_0.field_0.w = dStack_310;
        local_288.transform.entries[1].field_0.field_0.x = local_348;
        local_288.transform.entries[1].field_0.field_0.y = dStack_340;
        local_288.transform.entries[1].field_0.field_0.z = dStack_338;
        local_288.transform.entries[1].field_0.field_0.w = dStack_330;
        local_288.transform.entries[0].field_0.field_0.x = (double)local_368;
        local_288.transform.entries[0].field_0.field_0.y = dStack_360;
        local_288.transform.entries[0].field_0.field_0.z = dStack_358;
        local_288.transform.entries[0].field_0.field_0.w = dStack_350;
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_598);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0]);
        }
      }
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,(char *)0x0);
    }
    if (local_568[0] != local_558) {
      operator_delete(local_568[0]);
    }
  } while (local_2e8 != 0);
  _local_2e8 = transform._0_8_;
  uStack_2e0 = transform._8_8_;
  uStack_2d8 = transform._16_8_;
  uStack_2d0 = transform._24_8_;
  local_598 = (ios_base *)transform._32_8_;
  uStack_590 = transform._40_8_;
  uStack_588 = transform._48_8_;
  uStack_580 = transform._56_8_;
  local_2a8 = transform._64_8_;
  uStack_2a0 = transform._72_8_;
  uStack_298 = transform._80_8_;
  uStack_290 = transform._88_8_;
  local_2c8 = transform._96_8_;
  uStack_2c0 = transform._104_8_;
  uStack_2b8 = transform._112_8_;
  uStack_2b0 = transform._120_8_;
  Matrix4x4::operator*((Matrix4x4 *)transform,&local_288.transform);
  local_288.transform.entries[3].field_0.field_0.x = local_158;
  local_288.transform.entries[3].field_0.field_0.y = dStack_150;
  local_288.transform.entries[3].field_0.field_0.z = dStack_148;
  local_288.transform.entries[3].field_0.field_0.w = dStack_140;
  local_288.transform.entries[2].field_0.field_0.x = local_178;
  local_288.transform.entries[2].field_0.field_0.y = dStack_170;
  local_288.transform.entries[2].field_0.field_0.z = dStack_168;
  local_288.transform.entries[2].field_0.field_0.w = dStack_160;
  local_288.transform.entries[1].field_0.field_0.x = local_198;
  local_288.transform.entries[1].field_0.field_0.y = dStack_190;
  local_288.transform.entries[1].field_0.field_0.z = dStack_188;
  local_288.transform.entries[1].field_0.field_0.w = dStack_180;
  local_288.transform.entries[0].field_0.field_0.x = (double)local_1b8;
  local_288.transform.entries[0].field_0.field_0.y = dStack_1b0;
  local_288.transform.entries[0].field_0.field_0.z = dStack_1a8;
  local_288.transform.entries[0].field_0.field_0.w = dStack_1a0;
  transform._0_8_ = local_1b8;
  transform._8_8_ = dStack_1b0;
  transform._16_8_ = dStack_1a8;
  transform._24_8_ = dStack_1a0;
  transform._32_8_ = local_198;
  transform._40_8_ = dStack_190;
  transform._48_8_ = dStack_188;
  transform._56_8_ = dStack_180;
  transform._64_8_ = local_178;
  transform._72_8_ = dStack_170;
  transform._80_8_ = dStack_168;
  transform._88_8_ = dStack_160;
  transform._96_8_ = local_158;
  transform._104_8_ = dStack_150;
  transform._112_8_ = dStack_148;
  transform._120_8_ = dStack_140;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"node","");
  pXVar4 = local_570;
  pXVar5 = get_element(local_570,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  for (; pXVar5 != (XMLElement *)0x0;
      pXVar5 = tinyxml2::XMLNode::NextSiblingElement(&pXVar5->super_XMLNode,"node")) {
    parse_node(pXVar5);
  }
  transform._0_8_ = _local_2e8;
  transform._8_8_ = uStack_2e0;
  transform._16_8_ = uStack_2d8;
  transform._24_8_ = uStack_2d0;
  transform._32_8_ = local_598;
  transform._40_8_ = uStack_590;
  transform._48_8_ = uStack_588;
  transform._56_8_ = uStack_580;
  transform._64_8_ = local_2a8;
  transform._72_8_ = uStack_2a0;
  transform._80_8_ = uStack_298;
  transform._88_8_ = uStack_290;
  transform._96_8_ = local_2c8;
  transform._104_8_ = uStack_2c0;
  transform._112_8_ = uStack_2b8;
  transform._120_8_ = uStack_2b0;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"instance_camera","");
  pXVar5 = get_element(pXVar4,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"instance_light","");
  xml_00 = get_element(pXVar4,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"instance_geometry","");
  xml_01 = get_element(pXVar4,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  if (pXVar5 == (XMLElement *)0x0) {
    if (xml_00 == (XMLElement *)0x0) {
      if (xml_01 != (XMLElement *)0x0) {
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"mesh","");
        pXVar5 = get_element(xml_01,&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        if (pXVar5 == (XMLElement *)0x0) {
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"extra","");
          pXVar5 = get_element(xml_01,&local_468);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p);
          }
          if (pXVar5 == (XMLElement *)0x0) goto LAB_001121a9;
          pLVar6 = (LightInfo *)operator_new(0x58);
          auVar9 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pLVar6->super_Instance = ZEXT1632(auVar9);
          *(undefined1 (*) [32])((long)&(pLVar6->super_Instance).id.field_2 + 8) = ZEXT1632(auVar9);
          *(undefined1 (*) [32])&(pLVar6->super_Instance).name.field_2 = ZEXT1632(auVar9);
          (pLVar6->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar6->super_Instance).id.field_2;
          (pLVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar6->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar6->super_Instance).name.field_2;
          (pLVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_sphere(xml_01,(SphereInfo *)pLVar6);
          local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_488,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar4 = get_element(pXVar4,&local_488);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p != &local_488.field_2) {
            operator_delete(local_488._M_dataplus._M_p);
          }
          local_288.instance = (Instance *)pLVar6;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001121a9;
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar3 == (char *)0x0) goto LAB_0011263a;
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          local_1b8 = &dStack_1a8;
          sVar7 = strlen(pcVar3 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b8,pcVar3 + 1,pcVar3 + sVar7 + 1);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4a8,local_1b8,(long)dStack_1b0 + (long)local_1b8);
          pXVar4 = uri_find(&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p);
          }
          if (pXVar4 == (XMLElement *)0x0) goto LAB_0011263a;
          pMVar8 = (MaterialInfo *)operator_new(0x50);
          auVar9 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pMVar8->super_Instance = ZEXT1632(auVar9);
          *(undefined1 (*) [32])((long)&(pMVar8->super_Instance).id.field_2 + 8) = ZEXT1632(auVar9);
          *(undefined1 (*) [32])&(pMVar8->super_Instance).name._M_string_length = ZEXT1632(auVar9);
          (pMVar8->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar8->super_Instance).id.field_2;
          (pMVar8->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar8->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar8->super_Instance).name.field_2;
          (pMVar8->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar8);
          *(MaterialInfo **)&(pLVar6->spectrum).field_0 = pMVar8;
        }
        else {
          pLVar6 = (LightInfo *)operator_new(0xb0);
          auVar9 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pLVar6->super_Instance = ZEXT1632(auVar9);
          *(undefined1 (*) [32])((long)&(pLVar6->super_Instance).id.field_2 + 8) = ZEXT1632(auVar9);
          aVar11 = (anon_union_32_3_e2189aaa_for_Vector3D_0)ZEXT1632(auVar9);
          *(anon_union_32_3_e2189aaa_for_Vector3D_0 *)((long)&(pLVar6->spectrum).field_0 + 0x10) =
               aVar11;
          *(anon_union_32_3_e2189aaa_for_Vector3D_0 *)
           ((long)&(pLVar6->super_Instance).name.field_2 + 8) = aVar11;
          *(anon_union_32_3_e2189aaa_for_Vector3D_0 *)((long)&(pLVar6->position).field_0 + 0x10) =
               aVar11;
          (pLVar6->direction).field_0 = aVar11;
          (pLVar6->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar6->super_Instance).id.field_2;
          (pLVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar6->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar6->super_Instance).name.field_2;
          (pLVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
          auVar10 = ZEXT1632(auVar9);
          *(undefined1 (*) [32])&pLVar6->light_type = auVar10;
          *(undefined1 (*) [32])((long)&(pLVar6->spectrum).field_0 + 0x18) = auVar10;
          *(undefined1 (*) [32])((long)&(pLVar6->position).field_0 + 0x18) = auVar10;
          parse_polymesh(xml_01,(PolymeshInfo *)pLVar6);
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_428,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar4 = get_element(pXVar4,&local_428);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p);
          }
          local_288.instance = (Instance *)pLVar6;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001121a9;
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar3 == (char *)0x0) {
LAB_0011263a:
            exit(1);
          }
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          local_1b8 = &dStack_1a8;
          sVar7 = strlen(pcVar3 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b8,pcVar3 + 1,pcVar3 + sVar7 + 1);
          local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_448,local_1b8,(long)dStack_1b0 + (long)local_1b8);
          pXVar4 = uri_find(&local_448);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_448._M_dataplus._M_p != &local_448.field_2) {
            operator_delete(local_448._M_dataplus._M_p);
          }
          if (pXVar4 == (XMLElement *)0x0) goto LAB_0011263a;
          pMVar8 = (MaterialInfo *)operator_new(0x50);
          auVar9 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pMVar8->super_Instance = ZEXT1632(auVar9);
          *(undefined1 (*) [32])((long)&(pMVar8->super_Instance).id.field_2 + 8) = ZEXT1632(auVar9);
          *(undefined1 (*) [32])&(pMVar8->super_Instance).name._M_string_length = ZEXT1632(auVar9);
          (pMVar8->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar8->super_Instance).id.field_2;
          (pMVar8->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar8->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar8->super_Instance).name.field_2;
          (pMVar8->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar8);
          *(MaterialInfo **)((long)&(pLVar6->direction).field_0 + 0x18) = pMVar8;
        }
        local_288.instance = &pLVar6->super_Instance;
        if (local_1b8 != &dStack_1a8) {
          operator_delete(local_1b8);
        }
      }
    }
    else {
      pLVar6 = (LightInfo *)operator_new(0xf0);
      LightInfo::LightInfo(pLVar6);
      parse_light(xml_00,pLVar6);
      local_288.instance = (Instance *)pLVar6;
    }
  }
  else {
    pLVar6 = (LightInfo *)operator_new(0xa0);
    auVar9 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])&pLVar6->super_Instance = ZEXT1632(auVar9);
    *(undefined1 (*) [32])((long)&(pLVar6->super_Instance).id.field_2 + 8) = ZEXT1632(auVar9);
    auVar10 = ZEXT1632(auVar9);
    *(undefined1 (*) [32])((long)&(pLVar6->super_Instance).name.field_2 + 8) = auVar10;
    *(undefined1 (*) [32])((long)&(pLVar6->spectrum).field_0 + 0x10) = auVar10;
    *(undefined1 (*) [32])((long)&(pLVar6->position).field_0 + 0x10) = auVar10;
    (pLVar6->super_Instance).id._M_dataplus._M_p = (pointer)&(pLVar6->super_Instance).id.field_2;
    (pLVar6->super_Instance).id.field_2._M_local_buf[0] = '\0';
    (pLVar6->super_Instance).name._M_dataplus._M_p = (pointer)&(pLVar6->super_Instance).name.field_2
    ;
    (pLVar6->super_Instance).name.field_2._M_local_buf[0] = '\0';
    *(undefined1 (*) [16])(pLVar6->spectrum).field_0.field_2.__vec = ZEXT416(0) << 0x40;
    (pLVar6->spectrum).field_0.field_0.z = 0.0;
    *(undefined1 (*) [16])(pLVar6->position).field_0.field_2.__vec = ZEXT416(0) << 0x40;
    (pLVar6->position).field_0.field_0.z = 0.0;
    parse_camera(pXVar5,(CameraInfo *)pLVar6);
    local_288.instance = (Instance *)pLVar6;
  }
LAB_001121a9:
  std::vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>::push_back(scene,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.name._M_dataplus._M_p != &local_288.name.field_2) {
    operator_delete(local_288.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.id._M_dataplus._M_p != &local_288.id.field_2) {
    operator_delete(local_288.id._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColladaParser::parse_node( XMLElement* xml ) {

  // create new node
  Node node = Node();

  // name & id
  node.id   = xml->Attribute( "id" );
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {

    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {

      string s = e->GetText();
      stringstream ss (s);

      Matrix4x4 mat;
      ss >> mat(0,0); ss >> mat(0,1); ss >> mat(0,2); ss >> mat(0,3);
      ss >> mat(1,0); ss >> mat(1,1); ss >> mat(1,2); ss >> mat(1,3);
      ss >> mat(2,0); ss >> mat(2,1); ss >> mat(2,2); ss >> mat(2,3);
      ss >> mat(3,0); ss >> mat(3,1); ss >> mat(3,2); ss >> mat(3,3);

      node.transform = mat; break;

    }

    // transformation - rotate
    if (name == "rotate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1,1); ss >> m(1,2);
          ss >> m(2,1); ss >> m(2,2);
          break;
        case 'Y':
          ss >> m(0,0); ss >> m(2,0);
          ss >> m(0,2); ss >> m(2,2);
          break;
        case 'Z':
          ss >> m(0,0); ss >> m(0,1);
          ss >> m(1,0); ss >> m(1,1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;

    }

    // transformation - translate
    if (name == "translate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,3); ss >> m(1,3); ss >> m(2,3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,0); ss >> m(1,1); ss >> m(1,1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera   = get_element(xml, "instance_camera");
  XMLElement* e_light    = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera( e_camera, *camera );
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light( e_light, *light );
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {

      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {

      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;

    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}